

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msocket.c
# Opt level: O1

int8_t msocket_unix_connect(msocket_t *self,char *socketPath)

{
  int8_t iVar1;
  int __fd;
  int iVar2;
  int *piVar3;
  size_t __n;
  char *__dest;
  sockaddr local_88;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 uStack_38;
  undefined6 uStack_30;
  undefined2 local_2a;
  undefined6 uStack_28;
  undefined8 uStack_22;
  
  if ((self == (msocket_t *)0x0) || ((self->socketMode & 2) != 0)) {
    piVar3 = __errno_location();
    *piVar3 = 0x16;
  }
  else if (self->handlerTable == (msocket_handler_t *)0x0) {
    piVar3 = __errno_location();
    *piVar3 = 0xe;
  }
  else {
    local_88.sa_data[6] = '\0';
    local_88.sa_data[7] = '\0';
    local_88.sa_data[8] = '\0';
    local_88.sa_data[9] = '\0';
    local_88.sa_data[10] = '\0';
    local_88.sa_data[0xb] = '\0';
    local_88.sa_data[0xc] = '\0';
    local_88.sa_data[0xd] = '\0';
    uStack_28 = 0;
    uStack_22 = 0;
    uStack_38 = 0;
    uStack_30 = 0;
    local_2a = 0;
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_70 = 0;
    if (*socketPath == '\0') {
      __dest = local_88.sa_data + 1;
      socketPath = socketPath + 1;
      __n = 0x6a;
    }
    else {
      __dest = local_88.sa_data;
      __n = 0x6b;
    }
    local_88.sa_family = 1;
    local_88.sa_data[0] = '\0';
    local_88.sa_data[1] = '\0';
    local_88.sa_data[2] = '\0';
    local_88.sa_data[3] = '\0';
    local_88.sa_data[4] = '\0';
    local_88.sa_data[5] = '\0';
    strncpy(__dest,socketPath,__n);
    __fd = socket(1,1,0);
    if (-1 < __fd) {
      iVar2 = connect(__fd,&local_88,0x6e);
      if (iVar2 < 0) {
        close(__fd);
      }
      else {
        self->tcpsockfd = __fd;
        self->socketMode = self->socketMode | 2;
        self->state = '\x04';
        self->newConnection = '\x01';
        iVar1 = msocket_startIoThread(self);
        if (-1 < iVar1) {
          return '\0';
        }
        close(self->tcpsockfd);
        self->state = '\x06';
      }
    }
  }
  return -1;
}

Assistant:

int8_t msocket_unix_connect(msocket_t *self, const char *socketPath)
{
   if( (self != 0) && ( (self->socketMode & MSOCKET_MODE_TCP) == 0) ){
      int result;
      if (self->handlerTable == 0) {
         errno = EFAULT;
         return -1;
      }
#ifndef _WIN32
      result = msocket_connect_unix_internal(self, socketPath);
      if (result < 0) {
         //errno alredy set by system call
         return -1;
      }

      self->socketMode |= MSOCKET_MODE_TCP; //Treat connection the same way as if it was set to TCP
      self->state = MSOCKET_STATE_ESTABLISHED;
      self->newConnection = 1;
      result = msocket_startIoThread(self);
      if (result < 0) {
         SOCKET_CLOSE(self->tcpsockfd);
         self->state = MSOCKET_STATE_CLOSED;
         return -1;
      }
      return 0;
#else
      (void)socketPath;
      errno = EAFNOSUPPORT; //UNIX domain socket not supported in Windows
      result = -1;
#endif // !_WIN32
   }
   errno = EINVAL;
   return -1;
}